

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_hashtable.cpp
# Opt level: O3

optional_idx __thiscall
duckdb::GroupedAggregateHashTable::TryAddConstantGroups
          (GroupedAggregateHashTable *this,DataChunk *groups,DataChunk *payload,
          unsafe_vector<idx_t> *filter)

{
  shared_ptr<duckdb::TupleDataLayout,_true> *this_00;
  DataChunk *this_01;
  Vector *result;
  data_ptr_t pdVar1;
  long lVar2;
  idx_t iVar3;
  idx_t iVar4;
  idx_t index;
  TupleDataLayout *pTVar5;
  ulong uVar6;
  optional_idx local_58;
  unsafe_vector<idx_t> *local_50;
  vector<duckdb::LogicalType,_true> local_48;
  
  if (groups->count < 2) {
    local_58.index = 0xffffffffffffffff;
  }
  else {
    this_01 = &(this->state).dict_state.unique_values;
    if (*(pointer *)
         ((long)&(this->state).dict_state.unique_values.data.
                 super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                 super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl + 8) ==
        (this->state).dict_state.unique_values.data.
        super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
        super__Vector_impl_data._M_start) {
      DataChunk::GetTypes(&local_48,groups);
      DataChunk::InitializeEmpty(this_01,&local_48);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_48);
    }
    DataChunk::Reference(this_01,groups);
    (this->state).dict_state.unique_values.count = 1;
    DataChunk::Flatten(this_01);
    result = &(this->state).dict_state.hashes;
    DataChunk::Hash(this_01,result);
    index = FindOrCreateGroupsInternal
                      (this,this_01,result,&(this->state).dict_state.new_dictionary_pointers,
                       &(this->state).new_groups);
    this_00 = &(this->super_BaseAggregateHashTable).layout_ptr;
    pTVar5 = shared_ptr<duckdb::TupleDataLayout,_true>::operator->(this_00);
    if ((pTVar5->aggregates).
        super_vector<duckdb::AggregateObject,_std::allocator<duckdb::AggregateObject>_>.
        super__Vector_base<duckdb::AggregateObject,_std::allocator<duckdb::AggregateObject>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        (pTVar5->aggregates).
        super_vector<duckdb::AggregateObject,_std::allocator<duckdb::AggregateObject>_>.
        super__Vector_base<duckdb::AggregateObject,_std::allocator<duckdb::AggregateObject>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      pdVar1 = (this->state).addresses.data;
      lVar2 = *(long *)(this->state).dict_state.new_dictionary_pointers.data;
      local_50 = filter;
      pTVar5 = shared_ptr<duckdb::TupleDataLayout,_true>::operator->(this_00);
      if (payload->count != 0) {
        iVar3 = pTVar5->flag_width;
        iVar4 = pTVar5->data_width;
        uVar6 = 0;
        do {
          *(idx_t *)(pdVar1 + uVar6 * 8) = lVar2 + iVar3 + iVar4;
          uVar6 = uVar6 + 1;
        } while (uVar6 < payload->count);
      }
      UpdateAggregates(this,payload,local_50);
    }
    optional_idx::optional_idx(&local_58,index);
  }
  return (optional_idx)local_58.index;
}

Assistant:

optional_idx GroupedAggregateHashTable::TryAddConstantGroups(DataChunk &groups, DataChunk &payload,
                                                             const unsafe_vector<idx_t> &filter) {
#ifndef DEBUG
	if (groups.size() <= 1) {
		// this only has a point if we have multiple groups
		return optional_idx();
	}
#endif
	auto &dict_state = state.dict_state;
	auto &unique_values = dict_state.unique_values;
	if (unique_values.ColumnCount() == 0) {
		unique_values.InitializeEmpty(groups.GetTypes());
	}
	// slice the dictionary
	unique_values.Reference(groups);
	unique_values.SetCardinality(1);
	unique_values.Flatten();

	auto &hashes = dict_state.hashes;
	unique_values.Hash(hashes);

	// add the single constant group to the hash table
	auto &new_dictionary_pointers = dict_state.new_dictionary_pointers;
	auto new_group_count = FindOrCreateGroups(unique_values, hashes, new_dictionary_pointers, state.new_groups);

	auto &aggregates = layout_ptr->GetAggregates();
	if (aggregates.empty()) {
		// early-out - no aggregates to update
		return new_group_count;
	}

	auto new_dict_addresses = FlatVector::GetData<uintptr_t>(new_dictionary_pointers);
	auto result_addresses = FlatVector::GetData<uintptr_t>(state.addresses);
	uintptr_t aggregate_address = new_dict_addresses[0] + layout_ptr->GetAggrOffset();
	for (idx_t i = 0; i < payload.size(); i++) {
		result_addresses[i] = aggregate_address;
	}

	// process the aggregates
	// FIXME: we can use simple_update here if the aggregates support it
	UpdateAggregates(payload, filter);

	return new_group_count;
}